

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_pem2der.c
# Opt level: O0

int pem2der_pass_helper(char *buf,int num,int w,void *data)

{
  int iVar1;
  long *in_RCX;
  int in_ESI;
  undefined8 in_RDI;
  size_t plen;
  pem2der_pass_data_st *pass_data;
  int local_30 [12];
  
  if (((in_RCX != (long *)0x0) && (*in_RCX != 0)) &&
     (iVar1 = (*(code *)*in_RCX)(in_RDI,(long)in_ESI,local_30,0,in_RCX[1]), iVar1 != 0)) {
    return local_30[0];
  }
  return -1;
}

Assistant:

static int pem2der_pass_helper(char *buf, int num, int w, void *data)
{
    struct pem2der_pass_data_st *pass_data = data;
    size_t plen;

    if (pass_data == NULL
        || pass_data->cb == NULL
        || !pass_data->cb(buf, num, &plen, NULL, pass_data->cbarg))
        return -1;
    return (int)plen;
}